

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O0

TableGet * __thiscall
wasm::Builder::makeTableGet(Builder *this,Name table,Expression *index,Type type)

{
  TableGet *this_00;
  TableGet *ret;
  Expression *index_local;
  Builder *this_local;
  Type type_local;
  Name table_local;
  
  type_local.id = table.super_IString.str._M_len;
  this_00 = MixedArena::alloc<wasm::TableGet>(&this->wasm->allocator);
  wasm::Name::operator=(&this_00->table,(Name *)&type_local);
  this_00->index = index;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)45>).super_Expression.type.id = type.id;
  TableGet::finalize(this_00);
  return this_00;
}

Assistant:

TableGet* makeTableGet(Name table, Expression* index, Type type) {
    auto* ret = wasm.allocator.alloc<TableGet>();
    ret->table = table;
    ret->index = index;
    ret->type = type;
    ret->finalize();
    return ret;
  }